

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O1

float __thiscall anon_unknown.dwarf_5f851::MapDriver::maxSpeedForCurvature(MapDriver *this)

{
  PolylineSegmentedPathwaySegmentRadii *pathway;
  uint uVar1;
  float fVar2;
  float fVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  float fVar4;
  Vec3 VVar5;
  float local_38;
  float fStack_34;
  Vec3 local_20;
  
  if (this->curvedSteering == true) {
    fVar4 = ABS((this->super_SimpleVehicle)._curvature) / 0.2;
    fVar2 = 1.0;
    if (fVar4 <= 1.0) {
      fVar2 = fVar4;
    }
    fVar4 = 0.0;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar3 = fVar2 * -0.9 + 1.0;
    this->annoteMaxRelSpeedCurve = fVar3;
    fVar2 = fVar3;
    if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
      pathway = this->path;
      local_20.z = fVar4;
      (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
      VVar5 = mapPointAndDirectionToTangent(pathway,&local_20,this->pathFollowDirection);
      fVar2 = VVar5.z;
      (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
        super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
        super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
        super_AbstractLocalSpace._vptr_AbstractLocalSpace[6])(this);
      local_38 = VVar5.x;
      fStack_34 = VVar5.y;
      fVar2 = fVar2 * VVar5.z + local_38 * extraout_XMM0_Da + fStack_34 * extraout_XMM0_Db;
      uVar1 = -(uint)(fVar2 < 0.0);
      fVar2 = (float)(uVar1 & 0x3e4ccccd | ~uVar1 & (uint)(fVar2 * 0.8 + 0.2));
      this->annoteMaxRelSpeedPath = fVar2;
      if (fVar3 <= fVar2) {
        fVar2 = fVar3;
      }
    }
  }
  else {
    fVar2 = 1.0;
  }
  this->annoteMaxRelSpeed = fVar2;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x20])(this);
  return extraout_XMM0_Da_00 * fVar2;
}

Assistant:

float maxSpeedForCurvature ()
        {
            float maxRelativeSpeed = 1;

            if (curvedSteering)
            {
                // compute an ad hoc "relative curvature"
                const float absC = absXXX (curvature ());
                const float maxC = 1 / minimumTurningRadius ();
                const float relativeCurvature = sqrtXXX (clip (absC/maxC, 0, 1));

                // map from full throttle when straight to 10% at max curvature
                const float curveSpeed = interpolate (relativeCurvature,1.0f,0.1f);
                annoteMaxRelSpeedCurve = curveSpeed;

                if (demoSelect != 2)
                {
                    maxRelativeSpeed = curveSpeed;
                }
                else
                {
                    // heading (unit tangent) of the path segment of interest
                    const Vec3 pathHeading =  mapPointAndDirectionToTangent( *path, position(), pathFollowDirection ); // path->tangentAt (position (), pathFollowDirection);
                    // measure how parallel we are to the path
                    const float parallelness = pathHeading.dot (forward ());

                    // determine relative speed for this heading
                    const float mw = 0.2f;
                    const float headingSpeed = ((parallelness < 0) ? mw :
                                                interpolate (parallelness,
                                                             mw, 1.0f));
                    maxRelativeSpeed = minXXX (curveSpeed, headingSpeed);
                    annoteMaxRelSpeedPath = headingSpeed;
                }
            }
            annoteMaxRelSpeed = maxRelativeSpeed;
            return maxSpeed () * maxRelativeSpeed;
        }